

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_zip_filename_encoding.c
# Opt level: O2

void test_zip_filename_encoding_CP932(void)

{
  int iVar1;
  char *pcVar2;
  archive_conflict *paVar3;
  archive_entry *paVar4;
  size_t used;
  char buff [4096];
  
  pcVar2 = setlocale(6,"Japanese_Japan");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = setlocale(6,"ja_JP.SJIS");
    if (pcVar2 == (char *)0x0) {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                     ,L'Ƹ');
      test_skipping("CP932/SJIS locale not available on this system.");
      return;
    }
  }
  paVar3 = (archive_conflict *)archive_write_new();
  iVar1 = archive_write_set_format_zip((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'ǀ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                      (void *)0x0);
  iVar1 = archive_write_set_options((archive *)paVar3,"hdrcharset=UTF-8");
  if (iVar1 != 0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                   ,L'ǂ');
    test_skipping("This system cannot convert character-set from CP932/SJIS to UTF-8.");
    archive_write_free((archive *)paVar3);
    return;
  }
  iVar1 = archive_write_open_memory((archive *)paVar3,buff,0x1000,&used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'ǈ',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
  paVar4 = archive_entry_new2(paVar3);
  archive_entry_set_pathname(paVar4,anon_var_dwarf_c4ee6 + 0xb);
  archive_entry_set_filetype(paVar4,0x8000);
  archive_entry_set_size(paVar4,0);
  iVar1 = archive_write_header((archive *)paVar3,paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'ǐ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",(void *)0x0
                     );
  archive_entry_free(paVar4);
  iVar1 = archive_write_free((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'ǒ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'ǖ',8,"0x08",(long)buff[7],"buff[7]",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'ǘ',buff + 0x1e,"buff + 30",anon_var_dwarf_671c9 + 0x10,
                      "\"\\xE8\\xA1\\xA8.txt\"",7,"7",(void *)0x0);
  paVar3 = (archive_conflict *)archive_write_new();
  iVar1 = archive_write_set_format_zip((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'Ǟ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                      (void *)0x0);
  iVar1 = archive_write_open_memory((archive *)paVar3,buff,0x1000,&used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'Ǡ',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
  paVar4 = archive_entry_new2(paVar3);
  archive_entry_set_pathname(paVar4,anon_var_dwarf_c4ee6 + 0xb);
  archive_entry_set_filetype(paVar4,0x8000);
  archive_entry_set_size(paVar4,0);
  iVar1 = archive_write_header((archive *)paVar3,paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'Ǩ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",(void *)0x0
                     );
  archive_entry_free(paVar4);
  iVar1 = archive_write_free((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'Ǫ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'Ǯ',0,"0",(long)buff[7],"buff[7]",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'Ǳ',buff + 0x1e,"buff + 30",anon_var_dwarf_c4ee6 + 0xb,"\"\\x95\\x5C.txt\""
                      ,6,"6",(void *)0x0);
  paVar3 = (archive_conflict *)archive_write_new();
  iVar1 = archive_write_set_format_zip((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'ǹ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                      (void *)0x0);
  iVar1 = archive_write_set_options((archive *)paVar3,"hdrcharset=UTF-8");
  if (iVar1 == 0) {
    iVar1 = archive_write_open_memory((archive *)paVar3,buff,0x1000,&used);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'ȁ',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
    paVar4 = archive_entry_new2(paVar3);
    archive_entry_set_pathname(paVar4,"abcABC");
    archive_entry_set_filetype(paVar4,0x8000);
    archive_entry_set_size(paVar4,0);
    iVar1 = archive_write_header((archive *)paVar3,paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'ȉ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                        (void *)0x0);
    archive_entry_free(paVar4);
    iVar1 = archive_write_free((archive *)paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'ȋ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'ȏ',0,"0",(long)buff[7],"buff[7]",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                        ,L'Ȑ',buff + 0x1e,"buff + 30","abcABC","\"abcABC\"",6,"6",(void *)0x0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                   ,L'ǻ');
    test_skipping("This system cannot convert character-set from CP932/SJIS to UTF-8.");
    archive_write_free((archive *)paVar3);
  }
  return;
}

Assistant:

DEFINE_TEST(test_zip_filename_encoding_CP932)
{
  	struct archive *a;
  	struct archive_entry *entry;
	char buff[4096];
	size_t used;

	if (NULL == setlocale(LC_ALL, "Japanese_Japan") &&
	    NULL == setlocale(LC_ALL, "ja_JP.SJIS")) {
		skipping("CP932/SJIS locale not available on this system.");
		return;
	}

	/*
	 * Verify that EUC-JP filenames are correctly translated to UTF-8.
	 */
	a = archive_write_new();
	assertEqualInt(ARCHIVE_OK, archive_write_set_format_zip(a));
	if (archive_write_set_options(a, "hdrcharset=UTF-8") != ARCHIVE_OK) {
		skipping("This system cannot convert character-set"
		    " from CP932/SJIS to UTF-8.");
		archive_write_free(a);
		return;
	}
	assertEqualInt(ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	entry = archive_entry_new2(a);
	/* Set a CP932/SJIS filename. */
	archive_entry_set_pathname(entry, "\x95\x5C.txt");
	/* Check the Unicode version. */
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_size(entry, 0);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* A bit 11 of general purpose flag should be 0x08,
	 * which indicates the filename charset is UTF-8. */
	assertEqualInt(0x08, buff[7]);
	/* Check UTF-8 version. */
	assertEqualMem(buff + 30, "\xE8\xA1\xA8.txt", 7);

	/*
	 * Verify that CP932/SJIS filenames are not translated to UTF-8.
	 */
	a = archive_write_new();
	assertEqualInt(ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	entry = archive_entry_new2(a);
	/* Set a CP932/SJIS filename. */
	archive_entry_set_pathname(entry, "\x95\x5C.txt");
	/* Check the Unicode version. */
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_size(entry, 0);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* A bit 11 of general purpose flag should be 0,
	 * which indicates the filename charset is unknown. */
	assertEqualInt(0, buff[7]);
	/* Above three characters in CP932/SJIS should not translate to
	 * any character-set. */
	assertEqualMem(buff + 30, "\x95\x5C.txt", 6);

	/*
	 * Verify that A bit 11 of general purpose flag is not set
	 * when ASCII filenames are stored even if hdrcharset=UTF-8
	 * is specified.
	 */
	a = archive_write_new();
	assertEqualInt(ARCHIVE_OK, archive_write_set_format_zip(a));
	if (archive_write_set_options(a, "hdrcharset=UTF-8") != ARCHIVE_OK) {
		skipping("This system cannot convert character-set"
		    " from CP932/SJIS to UTF-8.");
		archive_write_free(a);
		return;
	}
	assertEqualInt(ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	entry = archive_entry_new2(a);
	/* Set an ASCII filename. */
	archive_entry_set_pathname(entry, "abcABC");
	/* Check the Unicode version. */
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_size(entry, 0);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* A bit 11 of general purpose flag should be 0,
	 * which indicates the filename charset is unknown. */
	assertEqualInt(0, buff[7]);
	assertEqualMem(buff + 30, "abcABC", 6);
}